

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoted.c
# Opt level: O2

Denoted * get_denoted_enum_const_num(token *id,Enum *parent,int value)

{
  Denoted *pDVar1;
  
  pDVar1 = (Denoted *)malloc(0x28);
  pDVar1->denotation = DT_Enum_Constant;
  *(token **)(pDVar1 + 2) = id;
  *(Enum **)(pDVar1 + 4) = parent;
  *(undefined8 *)(pDVar1 + 8) = 0;
  pDVar1[6].denotation = value;
  return pDVar1;
}

Assistant:

struct Denoted* get_denoted_enum_const_num(struct token *id,struct Enum *parent,int value)
{
	struct Denoted_Enum_Const *ret;
	ret=malloc(sizeof(struct Denoted_Enum_Const));
	ret->denotation=DT_Enum_Constant;
	ret->id=id;
	ret->parent=parent;
	ret->expression=NULL;
	ret->value=value;

	return (struct Denoted*)ret;
}